

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O0

string * __thiscall
AliHttpRequest::GetPath_abi_cxx11_
          (string *__return_storage_ptr__,AliHttpRequest *this,bool with_query)

{
  ulong uVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_1a;
  byte local_19;
  AliHttpRequest *pAStack_18;
  bool with_query_local;
  AliHttpRequest *this_local;
  string *path;
  
  local_1a = 0;
  local_19 = with_query;
  pAStack_18 = this;
  this_local = (AliHttpRequest *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->path_);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"/");
  }
  if (((this->is_tls & 1U) == 0) && (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    std::operator+(&local_70,"http://",&this->host_);
    std::operator+(&local_50,&local_70,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_19 & 1) != 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append(psVar2);
    }
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append(psVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AliHttpRequest::GetPath(bool with_query) {
  std::string path = this->path_;

  if(path.empty()) {
    path = "/";
  }

  // support http proxy only
  if(!this->is_tls && !this->proxy_host_.empty()) {
    path = "http://" + this->host_ + path;
  }
  
  if(with_query) {
    if(!this->query_.empty()) {
      path.append("?").append(query_);
    }
    if(!this->flagment_.empty()) {
      path.append("#").append(flagment_);
    }
  }

  return path;
}